

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::setupSharedStorageBuffers
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          samplingFunction *sampling_function,bufferCollection *buffers,GLuint program_id)

{
  samplerType sVar1;
  bool bVar2;
  GLuint program_id_00;
  bufferCollection *pbVar3;
  attributeDefinition *attribute;
  int iVar4;
  ulong uVar5;
  attributeDefinition *attribute_00;
  
  sVar1 = format->m_sampler_type;
  iVar4 = 0;
  attribute_00 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    attribute_00 = (attributeDefinition *)0x0;
  }
  switch(*sampling_function) {
  case Texture:
    attribute = getAttributes::texture_attributes;
    goto LAB_00d8573a;
  case TextureLod:
    attribute = getAttributes::textureLod_attributes;
    iVar4 = 2;
    break;
  case TextureGrad:
    attribute = getAttributes::textureGrad_attributes;
    iVar4 = 3;
    break;
  case TextureGather:
    attribute = getAttributes::textureGather_attributes;
LAB_00d8573a:
    iVar4 = 1;
    break;
  default:
    bVar2 = false;
    attribute = (attributeDefinition *)0x0;
    pbVar3 = buffers;
    goto LAB_00d85751;
  }
  bVar2 = true;
  pbVar3 = (bufferCollection *)&switchD_00d85719::switchdataD_01bbfd74;
LAB_00d85751:
  program_id_00 = (GLuint)pbVar3;
  if (bVar2) {
    uVar5 = (ulong)(iVar4 + (uint)(iVar4 == 0));
    do {
      setupSharedStorageBuffer(this,attribute,buffers,(GLuint)pbVar3);
      program_id_00 = (GLuint)pbVar3;
      attribute = attribute + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (sVar1 != Depth) {
    return;
  }
  setupSharedStorageBuffer(this,attribute_00,buffers,program_id_00);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::setupSharedStorageBuffers(const formatDefinition& format,
																const samplingFunction& sampling_function,
																const bufferCollection& buffers, glw::GLuint program_id)
{
	const attributeDefinition* format_attributes	= 0;
	glw::GLuint				   n_format_attributes  = 0;
	glw::GLuint				   n_routine_attributes = 0;
	const attributeDefinition* routine_attributes   = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupSharedStorageBuffer(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupSharedStorageBuffer(format_attributes[i], buffers, program_id);
	}
}